

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControl::ensureCursorVisible(QWidgetTextControl *this)

{
  QWidgetTextControlPrivate *_t1;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000014;
  QWidgetTextControlPrivate *in_stack_00000018;
  QWidgetTextControlPrivate *d;
  QRectF crect;
  QWidgetTextControl *this_00;
  QWidgetTextControlPrivate *xp1;
  QRectF *this_01;
  QWidgetTextControl local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  _t1 = d_func((QWidgetTextControl *)0x72097a);
  local_18 = 0xffffffffffffffff;
  uStack_10 = 0xffffffffffffffff;
  local_28 = 0xffffffffffffffff;
  uStack_20 = 0xffffffffffffffff;
  xp1 = _t1;
  QTextCursor::position();
  this_00 = &local_48;
  QWidgetTextControlPrivate::rectForPosition(in_stack_00000018,in_stack_00000014);
  QRectF::adjusted(this_01,(qreal)xp1,(qreal)in_RDI,(qreal)&local_28,(qreal)this_00);
  visibilityRequest(this_00,(QRectF *)_t1);
  microFocusChanged((QWidgetTextControl *)0x720a04);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::ensureCursorVisible()
{
    Q_D(QWidgetTextControl);
    QRectF crect = d->rectForPosition(d->cursor.position()).adjusted(-5, 0, 5, 0);
    emit visibilityRequest(crect);
    emit microFocusChanged();
}